

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O1

int OPENSSL_strcasecmp(char *a,char *b)

{
  uint uVar1;
  int in_EAX;
  size_t i;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  
  i = 0;
  do {
    uVar2 = (uint)a[i];
    uVar1 = uVar2 | 0x20;
    if (0x19 < uVar2 - 0x41) {
      uVar1 = uVar2;
    }
    uVar3 = (uint)b[i];
    uVar2 = uVar3 | 0x20;
    if (0x19 < uVar3 - 0x41) {
      uVar2 = uVar3;
    }
    if ((int)uVar1 < (int)uVar2) {
      in_EAX = -1;
LAB_004951e2:
      bVar4 = false;
    }
    else {
      if ((int)uVar2 < (int)uVar1) {
        in_EAX = 1;
        goto LAB_004951e2;
      }
      bVar4 = uVar1 != 0;
      if (!bVar4) {
        in_EAX = 0;
      }
    }
    i = i + 1;
    if (!bVar4) {
      return in_EAX;
    }
  } while( true );
}

Assistant:

int OPENSSL_strcasecmp(const char *a, const char *b) {
  for (size_t i = 0;; i++) {
    const int aa = OPENSSL_tolower(a[i]);
    const int bb = OPENSSL_tolower(b[i]);

    if (aa < bb) {
      return -1;
    } else if (aa > bb) {
      return 1;
    } else if (aa == 0) {
      return 0;
    }
  }
}